

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DecorationManager::AnalyzeDecorations(DecorationManager *this)

{
  bool bVar1;
  Instruction *inst_00;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  DecorationManager *this_local;
  
  if (this->module_ != (Module *)0x0) {
    Module::annotations((Module *)&__begin2);
    IteratorRange<spvtools::opt::InstructionList::iterator>::begin
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
    IteratorRange<spvtools::opt::InstructionList::iterator>::end
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
    while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&inst), bVar1)
    {
      inst_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
      AddDecoration(this,inst_00);
      InstructionList::iterator::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void DecorationManager::AnalyzeDecorations() {
  if (!module_) return;

  // For each group and instruction, collect all their decoration instructions.
  for (Instruction& inst : module_->annotations()) {
    AddDecoration(&inst);
  }
}